

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

mat<4UL,_4UL> *
operator*(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *lhs,mat<4UL,_4UL> *rhs)

{
  double dVar1;
  vec<4UL,_double> *pvVar2;
  double *pdVar3;
  size_t idx;
  size_t i;
  size_t idx_00;
  bool bVar4;
  vec<4UL,_double> local_50;
  
  __return_storage_ptr__->rows[3].data[2] = 0.0;
  __return_storage_ptr__->rows[3].data[3] = 0.0;
  __return_storage_ptr__->rows[3].data[0] = 0.0;
  __return_storage_ptr__->rows[3].data[1] = 0.0;
  __return_storage_ptr__->rows[2].data[2] = 0.0;
  __return_storage_ptr__->rows[2].data[3] = 0.0;
  __return_storage_ptr__->rows[2].data[0] = 0.0;
  __return_storage_ptr__->rows[2].data[1] = 0.0;
  __return_storage_ptr__->rows[1].data[2] = 0.0;
  __return_storage_ptr__->rows[1].data[3] = 0.0;
  __return_storage_ptr__->rows[1].data[0] = 0.0;
  __return_storage_ptr__->rows[1].data[1] = 0.0;
  __return_storage_ptr__->rows[0].data[2] = 0.0;
  __return_storage_ptr__->rows[0].data[3] = 0.0;
  __return_storage_ptr__->rows[0].data[0] = 0.0;
  __return_storage_ptr__->rows[0].data[1] = 0.0;
  idx_00 = 4;
  while (bVar4 = idx_00 != 0, idx_00 = idx_00 - 1, bVar4) {
    for (idx = 3; idx != 0xffffffffffffffff; idx = idx - 1) {
      pvVar2 = mat<4UL,_4UL>::operator[](lhs,idx_00);
      mat<4UL,_4UL>::col(&local_50,rhs,idx);
      dVar1 = dot<4ul,double>(pvVar2,&local_50);
      pvVar2 = mat<4UL,_4UL>::operator[](__return_storage_ptr__,idx_00);
      pdVar3 = vec<4UL,_double>::operator[](pvVar2,idx);
      *pdVar3 = dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat<R1, C2> operator*(const mat<R1, C1>& lhs, const mat<C1, C2>& rhs)
{
    mat<R1, C2> result;
    for (size_t i = R1; i--;)
        for (size_t j = C2; j--; result[i][j] = dot(lhs[i], rhs.col(j)))
            ;
    return result;
}